

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_get_expected_output_frame_count
                    (ma_data_converter *pConverter,ma_uint64 inputFrameCount,
                    ma_uint64 *pOutputFrameCount)

{
  undefined8 *in_RDX;
  ma_resampler *in_RSI;
  long in_RDI;
  ma_uint64 *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RDX == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RDX = 0;
    if (in_RDI == 0) {
      local_4 = MA_INVALID_ARGS;
    }
    else if (*(char *)(in_RDI + 299) == '\0') {
      *in_RDX = in_RSI;
      local_4 = MA_SUCCESS;
    }
    else {
      local_4 = ma_resampler_get_expected_output_frame_count
                          (in_RSI,(ma_uint64)in_RDX,in_stack_ffffffffffffffd8);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_converter_get_expected_output_frame_count(const ma_data_converter* pConverter, ma_uint64 inputFrameCount, ma_uint64* pOutputFrameCount)
{
    if (pOutputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pOutputFrameCount = 0;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConverter->hasResampler) {
        return ma_resampler_get_expected_output_frame_count(&pConverter->resampler, inputFrameCount, pOutputFrameCount);
    } else {
        *pOutputFrameCount = inputFrameCount;   /* 1:1 */
        return MA_SUCCESS;
    }
}